

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_diag_sse41_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int32_t *ptr_02;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar26;
  int iVar27;
  int iVar28;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar29;
  int iVar33;
  int iVar34;
  int iVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  uint uVar39;
  uint uVar40;
  uint uVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar43;
  undefined1 auVar42 [16];
  int iVar44;
  int iVar47;
  int iVar48;
  int iVar49;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int local_178;
  int iStack_174;
  int iStack_170;
  int iStack_16c;
  uint local_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [16];
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  undefined1 local_f8 [16];
  int *local_e0;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse41_128_32_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_diag_sse41_128_32_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_diag_sse41_128_32_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_diag_sse41_128_32_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_diag_sse41_128_32_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_diag_sse41_128_32_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_diag_sse41_128_32_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar18 = _s1Len + 3;
  uVar6 = s2Len + 3;
  iVar13 = -open;
  iVar12 = matrix->min;
  uVar17 = 0x80000000 - iVar12;
  if (iVar12 != iVar13 && SBORROW4(iVar12,iVar13) == iVar12 + open < 0) {
    uVar17 = open | 0x80000000;
  }
  iVar12 = uVar17 + 1;
  uVar17 = 0x7ffffffe - matrix->max;
  local_128 = 0;
  iStack_124 = 0;
  iStack_120 = 0;
  iStack_11c = 0;
  if (s1_beg == 0) {
    local_d8 = gap << 2;
    iStack_d4 = gap << 2;
    iStack_d0 = gap << 2;
    iStack_cc = gap << 2;
  }
  else {
    local_d8 = 0;
    iStack_d4 = 0;
    iStack_d0 = 0;
    iStack_cc = 0;
  }
  local_98._0_8_ = CONCAT44(iVar12,iVar12);
  local_98._8_8_ = CONCAT44(iVar12,iVar12);
  local_a8._8_8_ = local_98._8_8_;
  local_a8._0_8_ = local_98._0_8_;
  local_b8._8_8_ = local_98._8_8_;
  local_b8._0_8_ = local_98._0_8_;
  local_f8._8_8_ = local_98._8_8_;
  local_f8._0_8_ = local_98._0_8_;
  local_c8._8_8_ = local_98._8_8_;
  local_c8._0_8_ = local_98._0_8_;
  if (s1_beg == 0) {
    iStack_120 = iVar13 - gap;
    iStack_124 = iVar13 + gap * -2;
    local_128 = -(gap * 3 + open);
    iStack_11c = iVar13;
  }
  local_48 = gap;
  iStack_44 = gap;
  iStack_40 = gap;
  iStack_3c = gap;
  ppVar8 = parasail_result_new();
  if (ppVar8 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar8->flag | 0x4401002;
  uVar11 = (ulong)(s2Len + 6);
  ptr = parasail_memalign_int32_t(0x10,uVar11);
  ptr_00 = parasail_memalign_int32_t(0x10,uVar11);
  ptr_01 = parasail_memalign_int32_t(0x10,uVar11);
  if (ptr_01 == (int32_t *)0x0 || (ptr_00 == (int32_t *)0x0 || ptr == (int32_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int32_t(0x10,(long)iVar18);
    if (ptr_02 == (int32_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar11 = 0;
      do {
        ptr_02[uVar11] = piVar1[(byte)_s1[uVar11]];
        uVar11 = uVar11 + 1;
      } while ((uint)_s1Len != uVar11);
    }
    iVar22 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar18) {
      iVar22 = iVar18;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar22) * 4 + 4);
  }
  else {
    ptr_02 = (int32_t *)0x0;
  }
  local_78 = _s1Len - 1;
  iStack_74 = _s1Len - 1;
  iStack_70 = _s1Len - 1;
  iStack_6c = _s1Len - 1;
  piVar1 = matrix->mapper;
  uVar14 = (ulong)(uint)s2Len;
  uVar11 = 0;
  do {
    ptr[uVar11 + 3] = piVar1[(byte)_s2[uVar11]];
    uVar11 = uVar11 + 1;
  } while (uVar14 != uVar11);
  ptr[2] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  uVar7 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar6) {
    uVar7 = uVar6;
  }
  local_68 = open;
  iStack_64 = open;
  iStack_60 = open;
  iStack_5c = open;
  local_58 = s2Len;
  iStack_54 = s2Len;
  iStack_50 = s2Len;
  iStack_4c = s2Len;
  memset(ptr + uVar14 + 3,0,(ulong)(~s2Len + uVar7) * 4 + 4);
  uVar11 = 0;
  iVar18 = iVar13;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar11 + 3] = iVar18;
      ptr_01[uVar11 + 3] = iVar12;
      uVar11 = uVar11 + 1;
      iVar18 = iVar18 - gap;
    } while (uVar14 != uVar11);
  }
  else {
    do {
      ptr_00[uVar11 + 3] = 0;
      ptr_01[uVar11 + 3] = iVar12;
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
  }
  lVar9 = 0;
  do {
    ptr_00[lVar9] = iVar12;
    ptr_01[lVar9] = iVar12;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  lVar9 = uVar14 + 3;
  iVar18 = s2Len;
  do {
    ptr_00[lVar9] = iVar12;
    ptr_01[lVar9] = iVar12;
    lVar9 = lVar9 + 1;
    iVar18 = iVar18 + 1;
  } while (iVar18 < (int)uVar6);
  ptr_00[2] = 0;
  local_168 = uVar17;
  uStack_164 = uVar17;
  uStack_160 = uVar17;
  uStack_15c = uVar17;
  if (_s1Len < 1) {
    local_158._4_4_ = iVar12;
    local_158._0_4_ = iVar12;
    local_158._8_4_ = iVar12;
    local_158._12_4_ = iVar12;
    local_c8 = local_158;
    local_f8 = local_158;
    local_b8 = local_158;
  }
  else {
    local_e0 = matrix->matrix;
    uVar7 = _s1Len - 1;
    auVar3._4_4_ = iVar12;
    auVar3._0_4_ = iVar12;
    auVar3._8_4_ = iVar12;
    local_c8._12_4_ = iVar12;
    local_c8._0_12_ = auVar3;
    local_88 = local_c8 >> 0x20;
    auVar25 = local_88;
    uVar11 = 1;
    if (1 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    uVar10 = (ulong)(uint)_s1Len;
    local_178 = 3;
    iStack_174 = 2;
    iStack_170 = 1;
    iStack_16c = 0;
    uVar14 = 0;
    local_f8 = local_c8;
    local_b8 = local_c8;
    local_a8 = local_c8;
    local_98 = local_c8;
    local_158 = local_c8;
    do {
      uVar6 = (uint)uVar14;
      if (matrix->type == 0) {
        uVar15 = ptr_02[uVar14 + 1];
        uVar16 = ptr_02[uVar14 + 2];
        uVar20 = ptr_02[uVar14];
        uVar19 = ptr_02[uVar14 | 3];
      }
      else {
        uVar15 = uVar6 | 1;
        if (uVar10 <= (uVar14 | 1)) {
          uVar15 = uVar7;
        }
        uVar16 = uVar6 | 2;
        if (uVar10 <= (uVar14 | 2)) {
          uVar16 = uVar7;
        }
        uVar20 = uVar6;
        uVar19 = uVar6 | 3;
        if (uVar10 <= (uVar14 | 3)) {
          uVar19 = uVar7;
        }
      }
      iVar18 = matrix->size;
      uVar14 = uVar14 + 4;
      local_88._0_8_ = auVar3._4_8_;
      auVar50._12_4_ = ptr_00[2];
      auVar50._8_4_ = iVar12;
      auVar50._0_8_ = local_88._0_8_;
      ptr_00[2] = iVar13 - (int)uVar14 * gap;
      iVar22 = iVar13 - uVar6 * gap;
      if (s1_beg != 0) {
        iVar22 = 0;
      }
      auVar42._12_4_ = iVar22;
      auVar42._8_4_ = iVar12;
      auVar42._0_8_ = local_88._0_8_;
      auVar55._0_4_ = -(uint)(local_78 == local_178);
      auVar55._4_4_ = -(uint)(iStack_74 == iStack_174);
      auVar55._8_4_ = -(uint)(iStack_70 == iStack_170);
      auVar55._12_4_ = -(uint)(iStack_6c == iStack_16c);
      uVar21 = 0;
      in_XMM11 = pmovsxbd(in_XMM11,0xfffefd);
      auVar46._4_4_ = iVar12;
      auVar46._0_4_ = iVar12;
      auVar46._8_4_ = iVar12;
      auVar46._12_4_ = iVar12;
      auVar54 = auVar46;
      do {
        iVar43 = auVar42._12_4_;
        auVar52._0_8_ = auVar42._4_8_;
        auVar51._0_12_ = auVar42._4_12_;
        auVar51._12_4_ = iVar43;
        auVar52._8_8_ = auVar51._8_8_ & 0xffffffff | (ulong)(uint)ptr_00[uVar21 + 3] << 0x20;
        iVar29 = local_e0[(long)(int)(uVar19 * iVar18) + (long)ptr[uVar21]] + auVar50._0_4_;
        iVar33 = local_e0[(long)(int)(uVar16 * iVar18) + (long)ptr[uVar21 + 1]] + auVar50._4_4_;
        iVar34 = local_e0[(long)(int)(uVar15 * iVar18) + (long)ptr[uVar21 + 2]] + auVar50._8_4_;
        iVar35 = local_e0[(long)(int)(uVar20 * iVar18) + (long)ptr[uVar21 + 3]] + auVar50._12_4_;
        iVar22 = auVar42._4_4_ - local_68;
        iVar26 = auVar42._8_4_ - iStack_64;
        iVar27 = iVar43 - iStack_60;
        iVar28 = ptr_00[uVar21 + 3] - iStack_5c;
        iVar44 = auVar46._4_4_ - local_48;
        iVar47 = auVar46._8_4_ - iStack_44;
        iVar48 = auVar46._12_4_ - iStack_40;
        iVar49 = ptr_01[uVar21 + 3] - iStack_3c;
        auVar45._0_4_ = (uint)(iVar44 < iVar22) * iVar22 | (uint)(iVar44 >= iVar22) * iVar44;
        auVar45._4_4_ = (uint)(iVar47 < iVar26) * iVar26 | (uint)(iVar47 >= iVar26) * iVar47;
        auVar45._8_4_ = (uint)(iVar48 < iVar27) * iVar27 | (uint)(iVar48 >= iVar27) * iVar48;
        auVar45._12_4_ = (uint)(iVar49 < iVar28) * iVar28 | (uint)(iVar49 >= iVar28) * iVar49;
        iVar22 = auVar42._0_4_ - local_68;
        iVar26 = auVar42._4_4_ - iStack_64;
        iVar27 = auVar42._8_4_ - iStack_60;
        iVar43 = iVar43 - iStack_5c;
        iVar28 = auVar54._0_4_ - local_48;
        iVar44 = auVar54._4_4_ - iStack_44;
        iVar47 = auVar54._8_4_ - iStack_40;
        iVar48 = auVar54._12_4_ - iStack_3c;
        auVar53._0_4_ = (uint)(iVar28 < iVar22) * iVar22 | (uint)(iVar28 >= iVar22) * iVar28;
        auVar53._4_4_ = (uint)(iVar44 < iVar26) * iVar26 | (uint)(iVar44 >= iVar26) * iVar44;
        auVar53._8_4_ = (uint)(iVar47 < iVar27) * iVar27 | (uint)(iVar47 >= iVar27) * iVar47;
        auVar53._12_4_ = (uint)(iVar48 < iVar43) * iVar43 | (uint)(iVar48 >= iVar43) * iVar48;
        uVar6 = ((int)auVar53._0_4_ < (int)auVar45._0_4_) * auVar45._0_4_ |
                ((int)auVar53._0_4_ >= (int)auVar45._0_4_) * auVar53._0_4_;
        uVar39 = ((int)auVar53._4_4_ < (int)auVar45._4_4_) * auVar45._4_4_ |
                 ((int)auVar53._4_4_ >= (int)auVar45._4_4_) * auVar53._4_4_;
        uVar40 = ((int)auVar53._8_4_ < (int)auVar45._8_4_) * auVar45._8_4_ |
                 ((int)auVar53._8_4_ >= (int)auVar45._8_4_) * auVar53._8_4_;
        uVar41 = ((int)auVar53._12_4_ < (int)auVar45._12_4_) * auVar45._12_4_ |
                 ((int)auVar53._12_4_ >= (int)auVar45._12_4_) * auVar53._12_4_;
        auVar37._0_4_ = (uint)((int)uVar6 < iVar29) * iVar29 | ((int)uVar6 >= iVar29) * uVar6;
        auVar37._4_4_ = (uint)((int)uVar39 < iVar33) * iVar33 | ((int)uVar39 >= iVar33) * uVar39;
        auVar37._8_4_ = (uint)((int)uVar40 < iVar34) * iVar34 | ((int)uVar40 >= iVar34) * uVar40;
        auVar37._12_4_ = (uint)((int)uVar41 < iVar35) * iVar35 | ((int)uVar41 >= iVar35) * uVar41;
        iVar29 = in_XMM11._0_4_;
        auVar23._0_4_ = -(uint)(iVar29 == -1);
        iVar33 = in_XMM11._4_4_;
        auVar23._4_4_ = -(uint)(iVar33 == -1);
        iVar34 = in_XMM11._8_4_;
        iVar35 = in_XMM11._12_4_;
        auVar23._8_4_ = -(uint)(iVar34 == -1);
        auVar23._12_4_ = -(uint)(iVar35 == -1);
        auVar5._4_4_ = iStack_124;
        auVar5._0_4_ = local_128;
        auVar5._8_4_ = iStack_120;
        auVar5._12_4_ = iStack_11c;
        auVar42 = blendvps(auVar37,auVar5,auVar23);
        auVar54._4_4_ = iVar12;
        auVar54._0_4_ = iVar12;
        auVar54._8_4_ = iVar12;
        auVar54._12_4_ = iVar12;
        auVar46 = blendvps(auVar45,auVar54,auVar23);
        auVar54 = blendvps(auVar53,auVar54,auVar23);
        iVar22 = auVar42._0_4_;
        iVar26 = auVar42._4_4_;
        iVar28 = auVar42._12_4_;
        iVar27 = auVar42._8_4_;
        if (3 < uVar21) {
          local_168 = (uint)(iVar22 < (int)local_168) * iVar22 |
                      (iVar22 >= (int)local_168) * local_168;
          uStack_164 = (uint)(iVar26 < (int)uStack_164) * iVar26 |
                       (iVar26 >= (int)uStack_164) * uStack_164;
          uStack_160 = (uint)(iVar27 < (int)uStack_160) * iVar27 |
                       (iVar27 >= (int)uStack_160) * uStack_160;
          uStack_15c = (uint)(iVar28 < (int)uStack_15c) * iVar28 |
                       (iVar28 >= (int)uStack_15c) * uStack_15c;
          local_158._4_4_ =
               (uint)((int)local_158._4_4_ < iVar26) * iVar26 |
               (uint)((int)local_158._4_4_ >= iVar26) * local_158._4_4_;
          local_158._0_4_ =
               (uint)((int)local_158._0_4_ < iVar22) * iVar22 |
               (uint)((int)local_158._0_4_ >= iVar22) * local_158._0_4_;
          local_158._8_4_ =
               (uint)((int)local_158._8_4_ < iVar27) * iVar27 |
               (uint)((int)local_158._8_4_ >= iVar27) * local_158._8_4_;
          local_158._12_4_ =
               (uint)((int)local_158._12_4_ < iVar28) * iVar28 |
               (uint)((int)local_158._12_4_ >= iVar28) * local_158._12_4_;
        }
        auVar4._4_4_ = iStack_174;
        auVar4._0_4_ = local_178;
        auVar4._8_4_ = iStack_170;
        auVar4._12_4_ = iStack_16c;
        auVar30._0_4_ = -(uint)(local_178 < _s1Len);
        auVar30._4_4_ = -(uint)(iStack_174 < _s1Len);
        auVar30._8_4_ = -(uint)(iStack_170 < _s1Len);
        auVar30._12_4_ = -(uint)(iStack_16c < _s1Len);
        auVar24._0_4_ = -(uint)(iVar29 < local_58);
        auVar24._4_4_ = -(uint)(iVar33 < iStack_54);
        auVar24._8_4_ = -(uint)(iVar34 < iStack_50);
        auVar24._12_4_ = -(uint)(iVar35 < iStack_4c);
        auVar36._0_4_ = -(uint)(local_98._0_4_ < iVar22);
        auVar36._4_4_ = -(uint)(local_98._4_4_ < iVar26);
        auVar36._8_4_ = -(uint)(local_98._8_4_ < iVar27);
        auVar36._12_4_ = -(uint)(local_98._12_4_ < iVar28);
        auVar36 = ~in_XMM11 & auVar24 & auVar55 & auVar36;
        local_98 = blendvps(local_98,auVar37,auVar36);
        auVar38._0_4_ = -(uint)(s2Len + -1 == iVar29);
        auVar38._4_4_ = -(uint)(s2Len + -1 == iVar33);
        auVar38._8_4_ = -(uint)(s2Len + -1 == iVar34);
        auVar38._12_4_ = -(uint)(s2Len + -1 == iVar35);
        auVar31._0_4_ = -(uint)(local_a8._0_4_ < iVar22);
        auVar31._4_4_ = -(uint)(local_a8._4_4_ < iVar26);
        auVar31._8_4_ = -(uint)(local_a8._8_4_ < iVar27);
        auVar31._12_4_ = -(uint)(local_a8._12_4_ < iVar28);
        auVar31 = auVar30 & auVar38 & auVar31;
        local_a8 = blendvps(local_a8,auVar42,auVar31);
        local_b8 = blendvps(local_b8,auVar42,auVar38 & auVar55);
        local_f8 = blendvps(local_f8,auVar4,auVar31);
        local_c8 = blendvps(local_c8,in_XMM11,auVar36);
        ptr_00[uVar21] = iVar22;
        ptr_01[uVar21] = auVar46._0_4_;
        in_XMM11._0_4_ = iVar29 + 1;
        in_XMM11._4_4_ = iVar33 + 1;
        in_XMM11._8_4_ = iVar34 + 1;
        in_XMM11._12_4_ = iVar35 + 1;
        uVar21 = uVar21 + 1;
        auVar50 = auVar52;
      } while (uVar11 != uVar21);
      local_178 = local_178 + 4;
      iStack_174 = iStack_174 + 4;
      iStack_170 = iStack_170 + 4;
      iStack_16c = iStack_16c + 4;
      local_128 = local_128 - local_d8;
      iStack_124 = iStack_124 - iStack_d4;
      iStack_120 = iStack_120 - iStack_d0;
      iStack_11c = iStack_11c - iStack_cc;
    } while (uVar14 < uVar10);
    local_88 = auVar25;
  }
  lVar9 = 0;
  iVar28 = 0;
  iVar27 = 0;
  iVar13 = 0;
  iVar18 = iVar12;
  iVar22 = iVar12;
  iVar26 = iVar12;
  do {
    iVar29 = *(int *)(local_a8 + lVar9 * 4);
    if (iVar22 < iVar29) {
      iVar22 = iVar29;
      iVar27 = *(int *)(local_f8 + lVar9 * 4);
      iVar28 = *(int *)(local_f8 + lVar9 * 4);
    }
    else if ((iVar29 == iVar22) &&
            (iVar33 = *(int *)(local_f8 + lVar9 * 4), bVar2 = iVar33 < iVar27, iVar27 = iVar28,
            bVar2)) {
      iVar22 = iVar29;
      iVar27 = iVar33;
      iVar28 = iVar33;
    }
    if (iVar26 < *(int *)(local_98 + lVar9 * 4)) {
      iVar13 = *(int *)(local_c8 + lVar9 * 4);
      iVar26 = *(int *)(local_98 + lVar9 * 4);
    }
    if (iVar18 < *(int *)(local_b8 + lVar9 * 4)) {
      iVar18 = *(int *)(local_b8 + lVar9 * 4);
    }
    lVar9 = lVar9 + 1;
  } while ((int)lVar9 != 4);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar27 = _s1Len - 1;
      iVar22 = s2Len + -1;
      if (s2_end != 0) {
        iVar18 = iVar26;
        iVar22 = iVar13;
      }
      goto LAB_0067eb23;
    }
  }
  else if (iVar22 <= iVar26) {
    if ((iVar22 != iVar26) || (iVar18 = iVar22, iVar22 = s2Len + -1, iVar13 != s2Len + -1)) {
      iVar27 = _s1Len - 1;
      iVar18 = iVar26;
      iVar22 = iVar13;
    }
    goto LAB_0067eb23;
  }
  iVar18 = iVar22;
  iVar22 = s2Len + -1;
LAB_0067eb23:
  auVar25._0_4_ = -(uint)((int)local_168 < iVar12);
  auVar25._4_4_ = -(uint)((int)uStack_164 < iVar12);
  auVar25._8_4_ = -(uint)((int)uStack_160 < iVar12);
  auVar25._12_4_ = -(uint)((int)uStack_15c < iVar12);
  auVar32._0_4_ = -(uint)((int)uVar17 < local_158._0_4_);
  auVar32._4_4_ = -(uint)((int)uVar17 < local_158._4_4_);
  auVar32._8_4_ = -(uint)((int)uVar17 < local_158._8_4_);
  auVar32._12_4_ = -(uint)((int)uVar17 < local_158._12_4_);
  iVar12 = movmskps(iVar13,auVar32 | auVar25);
  if (iVar12 != 0) {
    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
    iVar18 = 0;
    iVar22 = 0;
    iVar27 = 0;
  }
  ppVar8->score = iVar18;
  ppVar8->end_query = iVar27;
  ppVar8->end_ref = iVar22;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar8;
  }
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = s1_beg ? _mm_set1_epi32(0) : _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi32(0) : _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m128i vIltLimit = _mm_cmplt_epi32(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi32(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32(vWH, s1_beg ? 0 : (-open - i*gap), 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, F_pr[j], 3);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32(vNWH, vE);
            vWH = _mm_max_epi32(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi32(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi32(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi32(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi32(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int32_t max_row = NEG_LIMIT;
        int32_t max_col = NEG_LIMIT;
        int32_t last_val = NEG_LIMIT;
        int32_t *s = (int32_t*)&vMaxHRow;
        int32_t *t = (int32_t*)&vMaxHCol;
        int32_t *u = (int32_t*)&vLastVal;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}